

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O0

Type __thiscall wasm::TypeMapper::getNewType(TypeMapper *this,Type type)

{
  bool bVar1;
  HeapType HVar2;
  Type type_00;
  TypeMapper *this_local;
  Type type_local;
  
  this_local = (TypeMapper *)type.id;
  bVar1 = wasm::Type::isRef((Type *)&this_local);
  if (bVar1) {
    HVar2 = wasm::Type::getHeapType((Type *)&this_local);
    HVar2 = getNewHeapType(this,HVar2);
    type_00 = wasm::Type::with((Type *)&this_local,HVar2);
    type_local = GlobalTypeRewriter::getTempType(&this->super_GlobalTypeRewriter,type_00);
  }
  else {
    type_local.id = (uintptr_t)this_local;
  }
  return (Type)type_local.id;
}

Assistant:

Type getNewType(Type type) {
    if (!type.isRef()) {
      return type;
    }
    return getTempType(type.with(getNewHeapType(type.getHeapType())));
  }